

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O2

int SUNLinSolFree_SPGMR(SUNLinearSolver S)

{
  void *__ptr;
  int *__ptr_00;
  long lVar1;
  
  if (S != (SUNLinearSolver)0x0) {
    __ptr_00 = (int *)S->content;
    if (__ptr_00 != (int *)0x0) {
      if (*(N_Vector *)(__ptr_00 + 0x1e) != (N_Vector)0x0) {
        N_VDestroy(*(N_Vector *)(__ptr_00 + 0x1e));
        __ptr_00 = (int *)S->content;
        __ptr_00[0x1e] = 0;
        __ptr_00[0x1f] = 0;
      }
      if (*(N_Vector *)(__ptr_00 + 0x22) != (N_Vector)0x0) {
        N_VDestroy(*(N_Vector *)(__ptr_00 + 0x22));
        __ptr_00 = (int *)S->content;
        __ptr_00[0x22] = 0;
        __ptr_00[0x23] = 0;
      }
      if (*(N_Vector **)(__ptr_00 + 0x18) != (N_Vector *)0x0) {
        N_VDestroyVectorArray(*(N_Vector **)(__ptr_00 + 0x18),*__ptr_00 + 1);
        __ptr_00 = (int *)S->content;
        __ptr_00[0x18] = 0;
        __ptr_00[0x19] = 0;
      }
      if (*(long *)(__ptr_00 + 0x1a) != 0) {
        for (lVar1 = 0; lVar1 <= *__ptr_00; lVar1 = lVar1 + 1) {
          __ptr = *(void **)((long)*(void **)(__ptr_00 + 0x1a) + lVar1 * 8);
          if (__ptr != (void *)0x0) {
            free(__ptr);
            *(undefined8 *)(*(long *)((long)S->content + 0x68) + lVar1 * 8) = 0;
            __ptr_00 = (int *)S->content;
          }
        }
        free(*(void **)(__ptr_00 + 0x1a));
        __ptr_00 = (int *)S->content;
        __ptr_00[0x1a] = 0;
        __ptr_00[0x1b] = 0;
      }
      if (*(void **)(__ptr_00 + 0x1c) != (void *)0x0) {
        free(*(void **)(__ptr_00 + 0x1c));
        __ptr_00 = (int *)S->content;
        __ptr_00[0x1c] = 0;
        __ptr_00[0x1d] = 0;
      }
      if (*(void **)(__ptr_00 + 0x20) != (void *)0x0) {
        free(*(void **)(__ptr_00 + 0x20));
        __ptr_00 = (int *)S->content;
        __ptr_00[0x20] = 0;
        __ptr_00[0x21] = 0;
      }
      if (*(void **)(__ptr_00 + 0x24) != (void *)0x0) {
        free(*(void **)(__ptr_00 + 0x24));
        __ptr_00 = (int *)S->content;
        __ptr_00[0x24] = 0;
        __ptr_00[0x25] = 0;
      }
      if (*(void **)(__ptr_00 + 0x26) != (void *)0x0) {
        free(*(void **)(__ptr_00 + 0x26));
        __ptr_00 = (int *)S->content;
        __ptr_00[0x26] = 0;
        __ptr_00[0x27] = 0;
      }
      free(__ptr_00);
      S->content = (void *)0x0;
    }
    free(S->ops);
    free(S);
  }
  return 0;
}

Assistant:

int SUNLinSolFree_SPGMR(SUNLinearSolver S)
{
  int k;

  if (S == NULL) return(SUNLS_SUCCESS);

  if (S->content) {
    /* delete items from within the content structure */
    if (SPGMR_CONTENT(S)->xcor) {
      N_VDestroy(SPGMR_CONTENT(S)->xcor);
      SPGMR_CONTENT(S)->xcor = NULL;
    }
    if (SPGMR_CONTENT(S)->vtemp) {
      N_VDestroy(SPGMR_CONTENT(S)->vtemp);
      SPGMR_CONTENT(S)->vtemp = NULL;
    }
    if (SPGMR_CONTENT(S)->V) {
      N_VDestroyVectorArray(SPGMR_CONTENT(S)->V,
                            SPGMR_CONTENT(S)->maxl+1);
      SPGMR_CONTENT(S)->V = NULL;
    }
    if (SPGMR_CONTENT(S)->Hes) {
      for (k=0; k<=SPGMR_CONTENT(S)->maxl; k++)
        if (SPGMR_CONTENT(S)->Hes[k]) {
          free(SPGMR_CONTENT(S)->Hes[k]);
          SPGMR_CONTENT(S)->Hes[k] = NULL;
        }
      free(SPGMR_CONTENT(S)->Hes);
      SPGMR_CONTENT(S)->Hes = NULL;
    }
    if (SPGMR_CONTENT(S)->givens) {
      free(SPGMR_CONTENT(S)->givens);
      SPGMR_CONTENT(S)->givens = NULL;
    }
    if (SPGMR_CONTENT(S)->yg) {
      free(SPGMR_CONTENT(S)->yg);
      SPGMR_CONTENT(S)->yg = NULL;
    }
    if (SPGMR_CONTENT(S)->cv) {
      free(SPGMR_CONTENT(S)->cv);
      SPGMR_CONTENT(S)->cv = NULL;
    }
    if (SPGMR_CONTENT(S)->Xv) {
      free(SPGMR_CONTENT(S)->Xv);
      SPGMR_CONTENT(S)->Xv = NULL;
    }
    free(S->content); S->content = NULL;
  }
  if (S->ops) { free(S->ops); S->ops = NULL; }
  free(S); S = NULL;
  return(SUNLS_SUCCESS);
}